

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_mask.cpp
# Opt level: O2

void __thiscall
cppurses::detail::Screen_mask::Screen_mask(Screen_mask *this,Widget *w,Constructor_tag tag)

{
  size_t sVar1;
  size_t sVar2;
  allocator_type local_19;
  
  if (tag == Outer) {
    sVar1 = (w->top_left_position_).y;
    (this->offset_).x = (w->top_left_position_).x;
    (this->offset_).y = sVar1;
    sVar1 = w->outer_width_;
    sVar2 = w->outer_height_;
  }
  else {
    sVar1 = Widget::inner_x(w);
    sVar2 = Widget::inner_y(w);
    (this->offset_).x = sVar1;
    (this->offset_).y = sVar2;
    sVar1 = Widget::width(w);
    sVar2 = Widget::height(w);
  }
  (this->area_).width = sVar1;
  (this->area_).height = sVar2;
  std::vector<bool,_std::allocator<bool>_>::vector(&this->bits_,sVar2 * sVar1,&local_19);
  return;
}

Assistant:

Screen_mask::Screen_mask(const Widget& w, Constructor_tag tag)
    : offset_{make_offset(w, tag)},
      area_{make_area(w, tag)},
      bits_(area_.width * area_.height) {}